

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O2

Mesh * vera::planeMesh(Mesh *__return_storage_ptr__,float _width,float _height,int _columns,
                      int _rows,DrawMode _drawMode)

{
  uint uVar1;
  int iVar2;
  DrawMode DVar3;
  uint uVar4;
  uint32_t _i;
  uint uVar5;
  uint32_t _i_00;
  int iVar6;
  int ix;
  int iVar7;
  int iVar8;
  bool bVar9;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aVar10;
  uint32_t local_94;
  undefined8 local_58;
  vec3 local_50;
  vec3 local_40;
  
  Mesh::Mesh(__return_storage_ptr__);
  DVar3 = TRIANGLES;
  if (0xfffffffd < _drawMode - TRIANGLE_FAN) {
    DVar3 = _drawMode;
  }
  iVar6 = _columns + 1;
  local_50.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_50.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  __return_storage_ptr__->m_drawMode = DVar3;
  local_50.field_2.z = 0.0;
  local_40.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_40.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_58._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_58._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  local_40.field_2.z = 1.0;
  for (iVar2 = 0; iVar2 != _rows + 1; iVar2 = iVar2 + 1) {
    aVar10.y = 1.0 - (float)iVar2 / ((float)(_rows + 1) + -1.0);
    for (iVar7 = 0; iVar6 != iVar7; iVar7 = iVar7 + 1) {
      local_58._0_4_ = (float)iVar7 / ((float)iVar6 + -1.0);
      local_58._4_4_ = aVar10.y;
      local_50.field_1.y = _height * -0.5 - (aVar10.y + -1.0) * _height;
      local_50.field_0.x = local_58._0_4_ * _width + _width * -0.5;
      Mesh::addVertex(__return_storage_ptr__,&local_50);
      Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_58);
      Mesh::addNormal(__return_storage_ptr__,&local_40);
    }
  }
  if (DVar3 == TRIANGLE_STRIP) {
    uVar5 = 0;
    uVar4 = 0;
    if (0 < _rows) {
      uVar4 = _rows;
    }
    while (uVar5 != uVar4) {
      if ((uVar5 & 1) == 0) {
        for (iVar2 = 0; iVar2 <= _columns; iVar2 = iVar2 + 1) {
          Mesh::addIndex(__return_storage_ptr__,uVar5 * iVar6 + iVar2);
          Mesh::addIndex(__return_storage_ptr__,(uVar5 + 1) * iVar6 + iVar2);
        }
        uVar5 = uVar5 | 1;
      }
      else {
        uVar1 = uVar5 + 1;
        iVar7 = uVar5 * iVar6;
        for (iVar2 = _columns; uVar5 = uVar1, 0 < iVar2; iVar2 = iVar2 + -1) {
          Mesh::addIndex(__return_storage_ptr__,uVar1 * iVar6 + iVar2);
          Mesh::addIndex(__return_storage_ptr__,iVar7 + -1 + iVar2);
        }
      }
    }
    if ((_rows & 1U) == 0) {
      Mesh::addIndex(__return_storage_ptr__,
                     (int)(((long)(__return_storage_ptr__->m_vertices).
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(__return_storage_ptr__->m_vertices).
                                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0xc) - iVar6);
    }
  }
  else {
    iVar2 = 0;
    if (0 < _columns) {
      iVar2 = _columns;
    }
    local_94 = 0;
    if (_rows < 1) {
      _rows = 0;
    }
    iVar7 = 0;
    while (iVar7 != _rows) {
      iVar7 = iVar7 + 1;
      iVar8 = iVar2;
      _i_00 = local_94;
      while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
        Mesh::addIndex(__return_storage_ptr__,_i_00);
        _i = _i_00 + 1;
        Mesh::addIndex(__return_storage_ptr__,_i);
        Mesh::addIndex(__return_storage_ptr__,iVar6 + _i_00);
        Mesh::addIndex(__return_storage_ptr__,_i);
        Mesh::addIndex(__return_storage_ptr__,_i_00 + _columns + 2);
        Mesh::addIndex(__return_storage_ptr__,iVar6 + _i_00);
        _i_00 = _i;
      }
      local_94 = local_94 + iVar6;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh planeMesh(float _width, float _height, int _columns, int _rows, DrawMode _drawMode) {
    Mesh mesh;

    if (_drawMode != TRIANGLE_STRIP && _drawMode != TRIANGLES)
        _drawMode = TRIANGLES;

    _columns++;
    _rows++;

    mesh.setDrawMode(_drawMode);

    glm::vec3 vert(0.0f, 0.0f, 0.0f);
    glm::vec3 normal(0.0f, 0.0f, 1.0f); // always facing forward //
    glm::vec2 texcoord(0.0f, 0.0f);

    // the origin of the plane is at the center //
    float halfW = _width  * 0.5f;
    float halfH = _height * 0.5f;
    
    // add the vertexes //
    for (int iy = 0; iy != _rows; iy++) {
        for (int ix = 0; ix != _columns; ix++) {

            // normalized tex coords //
            texcoord.x =       ((float)ix/((float)_columns-1));
            texcoord.y = 1.f - ((float)iy/((float)_rows-1));

            vert.x = texcoord.x * _width - halfW;
            vert.y = -(texcoord.y-1) * _height - halfH;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    if (_drawMode == TRIANGLE_STRIP) {
        for (int y = 0; y < _rows-1; y++) {
            // even _rows //
            if ((y&1)==0) {
                for (int x = 0; x < _columns; x++) {
                    mesh.addIndex( (y) * _columns + x );
                    mesh.addIndex( (y+1) * _columns + x);
                }
            }
            else {
                for (int x = _columns-1; x >0; x--) {
                    mesh.addIndex( (y+1) * _columns + x );
                    mesh.addIndex( y * _columns + x-1 );
                }
            }
        }

        if (_rows%2 != 0) mesh.addIndex(mesh.getVerticesTotal() - _columns);
    }
    else {

        // Triangles //
        for (int y = 0; y < _rows - 1; y++) {
            for (int x = 0; x < _columns - 1; x++) {
                // first triangle //
                mesh.addIndex((y) *_columns + x);
                mesh.addIndex((y) *_columns + x + 1);
                mesh.addIndex((y + 1) *_columns + x);

                // second triangle //
                mesh.addIndex((y) * _columns + x+1);
                mesh.addIndex((y + 1) *_columns + x+1);
                mesh.addIndex((y + 1) *_columns + x);
            }
        }
    }

    return mesh;
}